

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O3

span<const_slang::ConstantRange,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<const_slang::ConstantRange,_18446744073709551615UL>::subspan
          (span<const_slang::ConstantRange,_18446744073709551615UL> *this,size_type offset,
          size_type count)

{
  ulong uVar1;
  size_type sVar2;
  span<const_slang::ConstantRange,_18446744073709551615UL> sVar3;
  
  uVar1 = this->size_;
  sVar2 = uVar1 - offset;
  if ((offset <= uVar1) &&
     (((count == 0xffffffffffffffff || (sVar2 = count, count + offset <= uVar1)) &&
      (sVar2 == 0 || this->data_ != (pointer)0x0)))) {
    sVar3.size_ = sVar2;
    sVar3.data_ = this->data_ + offset;
    return sVar3;
  }
  std::terminate();
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    subspan( size_type offset, size_type count = static_cast<size_type>(dynamic_extent) ) const
    {
        span_EXPECTS(
            ( ( detail::is_positive( offset ) && offset <= size() ) ) &&
            ( count == static_cast<size_type>(dynamic_extent) || ( detail::is_positive( count ) && offset + count <= size() ) )
        );

        return span< element_type, dynamic_extent >(
            data() + offset, count == static_cast<size_type>(dynamic_extent) ? size() - offset : count );
    }